

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

void Cbs2_ManAssign(Cbs2_Man_t *p,int iLit,int Level,int iRes0,int iRes1)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar4 = (uint)iLit >> 1;
  uVar3 = uVar4 * 3;
  if ((p->vLevReason).nSize <= (int)uVar3) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((p->vLevReason).pArray[uVar3] != -1) {
    __assert_fail("Cbs2_VarUnused(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x23d,"void Cbs2_ManAssign(Cbs2_Man_t *, int, int, int, int)");
  }
  if ((int)uVar4 < (p->vAssign).nSize) {
    pcVar2 = (p->vAssign).pArray;
    if (pcVar2[uVar4] < '\x02') {
      __assert_fail("!Cbs2_VarIsAssigned(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                    ,0x23e,"void Cbs2_ManAssign(Cbs2_Man_t *, int, int, int, int)");
    }
    pcVar2[uVar4] = ~(byte)iLit & 1;
    iVar1 = (p->pProp).nSize;
    if ((p->pProp).iTail == iVar1) {
      (p->pProp).nSize = iVar1 * 2;
      piVar5 = (p->pProp).pData;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)iVar1 << 3);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)iVar1 << 3);
      }
      (p->pProp).pData = piVar5;
    }
    iVar1 = (p->pProp).iTail;
    (p->pProp).iTail = iVar1 + 1;
    (p->pProp).pData[iVar1] = iLit;
    if ((int)uVar3 < (p->vLevReason).nSize) {
      piVar5 = (p->vLevReason).pArray;
      piVar5[uVar3] = Level;
      if ((int)(uVar3 + 1) < (p->vLevReason).nSize) {
        piVar5[uVar3 + 1] = iRes0;
        if ((int)(uVar3 + 2) < (p->vLevReason).nSize) {
          piVar5[uVar3 + 2] = iRes1;
          return;
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline void Cbs2_ManAssign( Cbs2_Man_t * p, int iLit, int Level, int iRes0, int iRes1 )
{
    int iObj = Abc_Lit2Var(iLit);
    assert( Cbs2_VarUnused(p, iObj) );
    assert( !Cbs2_VarIsAssigned(p, iObj) );
    //Cbs2_VarAssign( p, iObj );
    Cbs2_VarSetValue( p, iObj, !Abc_LitIsCompl(iLit) );
    Cbs2_QuePush( &p->pProp, iLit );
    Vec_IntWriteEntry( &p->vLevReason, 3*iObj,   Level );
    Vec_IntWriteEntry( &p->vLevReason, 3*iObj+1, iRes0 );
    Vec_IntWriteEntry( &p->vLevReason, 3*iObj+2, iRes1 );
}